

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O1

Aig_Man_t * Aig_ManDupExor(Aig_Man_t *p)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  Aig_Type_t AVar4;
  int iVar5;
  Aig_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  int *__dest;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *pAVar10;
  Tim_Man_t *pTVar11;
  Aig_Type_t AVar12;
  ulong uVar13;
  Aig_Obj_t *p1;
  long lVar14;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  p_00->fCatchExor = 1;
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    iVar5 = pVVar2->nSize;
    lVar14 = (long)iVar5;
    pVVar8->nSize = iVar5;
    pVVar8->nCap = iVar5;
    if (lVar14 == 0) {
      __dest = (int *)0x0;
    }
    else {
      __dest = (int *)malloc(lVar14 * 4);
    }
    pVVar8->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,lVar14 << 2);
    p_00->vFlopNums = pVVar8;
  }
  Aig_ManCleanData(p);
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar14];
      if (pvVar3 != (void *)0x0) {
        AVar12 = (Aig_Type_t)*(undefined8 *)((long)pvVar3 + 0x18);
        AVar4 = AVar12 & AIG_OBJ_VOID;
        if (AVar4 == AIG_OBJ_BUF) {
          if (((ulong)pvVar3 & 1) != 0) {
LAB_006b86d6:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar13 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (uVar13 == 0) {
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar10 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar13 + 0x28));
          }
        }
        else {
          AVar12 = AVar12 & AIG_OBJ_VOID;
          if (AVar12 - AIG_OBJ_VOID < 0xfffffffe) {
            if (AVar4 == AIG_OBJ_CO) {
              if (((ulong)pvVar3 & 1) != 0) goto LAB_006b86d6;
              uVar13 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
              if (uVar13 == 0) {
                pAVar10 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar10 = (Aig_Obj_t *)
                          ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                          *(ulong *)(uVar13 + 0x28));
              }
              pAVar10 = Aig_ObjCreateCo(p_00,pAVar10);
            }
            else if (AVar4 == AIG_OBJ_CI) {
              pAVar10 = Aig_ObjCreateCi(p_00);
              *(ulong *)&pAVar10->field_0x18 =
                   *(ulong *)&pAVar10->field_0x18 & 0xff000000ffffffff |
                   *(ulong *)((long)pvVar3 + 0x18) & 0xffffff00000000;
            }
            else {
              if (((ulong)pvVar3 & 1) != 0) {
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                              ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
              }
              if (AVar4 != AIG_OBJ_CONST1) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                              ,0x1f8,"Aig_Man_t *Aig_ManDupExor(Aig_Man_t *)");
              }
              pAVar10 = p_00->pConst1;
            }
          }
          else {
            if (((ulong)pvVar3 & 1) != 0) goto LAB_006b86d6;
            uVar13 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
            if (uVar13 == 0) {
              pAVar10 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar10 = (Aig_Obj_t *)
                        ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar13 + 0x28)
                        );
            }
            uVar13 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
            if (uVar13 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^ *(ulong *)(uVar13 + 0x28));
            }
            pAVar10 = Aig_Oper(p_00,pAVar10,p1,AVar12);
          }
        }
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar10;
      }
      lVar14 = lVar14 + 1;
      pVVar9 = p->vObjs;
    } while (lVar14 < pVVar9->nSize);
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->nRegs);
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pTVar11 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar11;
  }
  iVar5 = Aig_ManCheck(p_00);
  if (iVar5 == 0) {
    puts("Aig_ManDupExor(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupExor( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->fCatchExor = 1;
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsBuf(pObj) )
        {
            pObjNew = Aig_ObjChild0Copy(pObj);
        }
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        }
        else if ( Aig_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
        }
        else if ( Aig_ObjIsCo(pObj) )
        {
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        }
        else if ( Aig_ObjIsConst1(pObj) )
        {
            pObjNew = Aig_ManConst1(pNew);
        }
        else
            assert( 0 );
        pObj->pData = pObjNew;
    }
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupExor(): The check has failed.\n" );
    return pNew;
}